

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLongStressCase.cpp
# Opt level: O0

int deqp::gls::generateRandomAttribData
              (vector<unsigned_char,_std::allocator<unsigned_char>_> *attrDataBuf,
              int *dataSizeBytesDst,VarSpec *attrSpec,int numVertices,Random *rnd)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  size_type sVar5;
  reference pvVar6;
  float fVar7;
  int local_60;
  int local_5c;
  int compNdx_1;
  int vtxNdx_1;
  int *data_1;
  int compNdx;
  int vtxNdx;
  float *data;
  int offsetInBuf;
  int componentSize;
  int numComponents;
  bool isFloat;
  Random *rnd_local;
  int numVertices_local;
  VarSpec *attrSpec_local;
  int *dataSizeBytesDst_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *attrDataBuf_local;
  
  bVar1 = glu::isDataTypeFloatOrVec(attrSpec->type);
  iVar2 = glu::getDataTypeScalarSize(attrSpec->type);
  sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(attrDataBuf);
  iVar3 = nextDivisible((int)sVar5,4);
  *dataSizeBytesDst = iVar2 * 4 * numVertices;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (attrDataBuf,(long)(iVar3 + *dataSizeBytesDst));
  if (bVar1) {
    pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (attrDataBuf,(long)iVar3);
    for (data_1._4_4_ = 0; data_1._4_4_ < numVertices; data_1._4_4_ = data_1._4_4_ + 1) {
      for (data_1._0_4_ = 0; (int)data_1 < iVar2; data_1._0_4_ = (int)data_1 + 1) {
        fVar7 = de::Random::getFloat
                          (rnd,*(float *)((long)&attrSpec->minValue + (long)(int)data_1 * 4),
                           *(float *)((long)&attrSpec->maxValue + (long)(int)data_1 * 4));
        *(float *)(pvVar6 + (long)(data_1._4_4_ * iVar2 + (int)data_1) * 4) = fVar7;
      }
    }
  }
  else {
    pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (attrDataBuf,(long)iVar3);
    for (local_5c = 0; local_5c < numVertices; local_5c = local_5c + 1) {
      for (local_60 = 0; local_60 < iVar2; local_60 = local_60 + 1) {
        iVar4 = de::Random::getInt(rnd,*(int *)((long)&attrSpec->minValue + (long)local_60 * 4),
                                   *(int *)((long)&attrSpec->maxValue + (long)local_60 * 4));
        *(int *)(pvVar6 + (long)(local_5c * iVar2 + local_60) * 4) = iVar4;
      }
    }
  }
  return iVar3;
}

Assistant:

static int generateRandomAttribData (vector<deUint8>& attrDataBuf, int& dataSizeBytesDst, const VarSpec& attrSpec, const int numVertices, Random& rnd)
{
	const bool	isFloat			= glu::isDataTypeFloatOrVec(attrSpec.type);
	const int	numComponents	= glu::getDataTypeScalarSize(attrSpec.type);
	const int	componentSize	= (int)(isFloat ? sizeof(GLfloat) : sizeof(GLint));
	const int	offsetInBuf		= nextDivisible((int)attrDataBuf.size(), componentSize); // Round up for alignment.

	DE_STATIC_ASSERT(sizeof(GLint) == sizeof(int));
	DE_STATIC_ASSERT(sizeof(GLfloat) == sizeof(float));

	dataSizeBytesDst = numComponents*componentSize*numVertices;

	attrDataBuf.resize(offsetInBuf + dataSizeBytesDst);

	if (isFloat)
	{
		float* const data = (float*)&attrDataBuf[offsetInBuf];

		for (int vtxNdx = 0; vtxNdx < numVertices; vtxNdx++)
			for (int compNdx = 0; compNdx < numComponents; compNdx++)
				data[vtxNdx*numComponents + compNdx] = rnd.getFloat(attrSpec.minValue.f[compNdx], attrSpec.maxValue.f[compNdx]);
	}
	else
	{
		DE_ASSERT(glu::isDataTypeIntOrIVec(attrSpec.type));

		int* const data = (int*)&attrDataBuf[offsetInBuf];

		for (int vtxNdx = 0; vtxNdx < numVertices; vtxNdx++)
			for (int compNdx = 0; compNdx < numComponents; compNdx++)
				data[vtxNdx*numComponents + compNdx] = rnd.getInt(attrSpec.minValue.i[compNdx], attrSpec.maxValue.i[compNdx]);
	}

	return offsetInBuf;
}